

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.c
# Opt level: O0

uint32_t radix8sort_u64(uint64_t *keys_in_out,uint64_t *keys_temp,uint32_t *values_in_out,
                       uint32_t *values_temp,uint32_t size)

{
  uint32_t uVar1;
  uint32_t *in_RCX;
  uint32_t *in_RDX;
  uint64_t *in_RSI;
  uint64_t *in_RDI;
  uint32_t in_R8D;
  
  uVar1 = radixsort_u64(8,in_RDI,in_RSI,in_RDX,in_RCX,in_R8D);
  return uVar1;
}

Assistant:

uint32_t radix8sort_u64(uint64_t* restrict keys_in_out, uint64_t* restrict keys_temp,
    uint32_t* restrict values_in_out, uint32_t* values_temp, uint32_t size)
{
    return radixsort_u64(8, keys_in_out, keys_temp, values_in_out, values_temp, size);
}